

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.c
# Opt level: O3

void add(sha512_ctx *ctx,void *p,size_t len)

{
  ulong uVar1;
  size_t __n;
  
  uVar1 = (ulong)((uint)ctx->bytes & 0x7f);
  if (0x7f < len + uVar1) {
    __n = 0x80 - uVar1;
    memcpy((void *)((long)ctx->s + uVar1 + 0x40),p,__n);
    ctx->bytes = ctx->bytes + __n;
    p = (void *)((long)p + __n);
    len = len - __n;
    Transform(ctx->s,(ctx->buf).u64);
    uVar1 = 0;
  }
  for (; 0x7f < len; len = len - 0x80) {
    Transform(ctx->s,(uint64_t *)p);
    ctx->bytes = ctx->bytes + 0x80;
    p = (void *)((long)p + 0x80);
  }
  if (len != 0) {
    memcpy((void *)((long)ctx->s + uVar1 + 0x40),p,len);
    ctx->bytes = ctx->bytes + len;
  }
  return;
}

Assistant:

static void add(struct ripemd160_ctx *ctx, const void *p, size_t len)
{
	const unsigned char *data = p;
	size_t bufsize = ctx->bytes % 64;

	if (bufsize + len >= 64) {
		/* Fill the buffer, and process it. */
		memcpy(ctx->buf.u8 + bufsize, data, 64 - bufsize);
		ctx->bytes += 64 - bufsize;
		data += 64 - bufsize;
		len -= 64 - bufsize;
		Transform(ctx->s, ctx->buf.u32);
		bufsize = 0;
	}

	while (len >= 64) {
		/* Process full chunks directly from the source. */
		if (alignment_ok(data, sizeof(uint32_t)))
			Transform(ctx->s, (const uint32_t *)data);
		else {
			memcpy(ctx->buf.u8, data, sizeof(ctx->buf));
			Transform(ctx->s, ctx->buf.u32);
		}
		ctx->bytes += 64;
		data += 64;
		len -= 64;
	}
	    
	if (len) {
		/* Fill the buffer with what remains. */
		memcpy(ctx->buf.u8 + bufsize, data, len);
		ctx->bytes += len;
	}
}